

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolLastFlag(SUNLinearSolver S,int myid)

{
  undefined8 uVar1;
  int iVar2;
  
  if (S == (SUNLinearSolver)0x0) {
    printf(">>> FAILED test -- SUNLinSolLastFlag, Proc %d \n",myid);
    iVar2 = 1;
  }
  else {
    uVar1 = SUNLinSolLastFlag();
    sync_device();
    iVar2 = 0;
    if (myid == 0) {
      iVar2 = 0;
      printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n",uVar1);
      if (print_time != 0) {
        printf("    SUNLinSolLastFlag Time: %22.15e \n \n",0);
      }
    }
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolLastFlag(SUNLinearSolver S, int myid)
{
  double start_time, stop_time;
  sunindextype lastflag;

  /* the only way for this test to fail is if S is NULL */
  if (S == NULL)
  {
    printf(">>> FAILED test -- SUNLinSolLastFlag, Proc %d \n", myid);
    return (1);
  }

  start_time = get_time();
  lastflag   = SUNLinSolLastFlag(S);
  sync_device();
  stop_time = get_time();

  if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n", (long int)lastflag);
    PRINT_TIME("    SUNLinSolLastFlag Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}